

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::java::anon_unknown_0::FieldDescriptorCompare::operator()
          (FieldDescriptorCompare *this,FieldDescriptor *f1,FieldDescriptor *f2)

{
  bool bVar1;
  byte extraout_var;
  
  if (this == (FieldDescriptorCompare *)0x0) {
    bVar1 = false;
  }
  else if (f1 == (FieldDescriptor *)0x0) {
    bVar1 = true;
  }
  else {
    std::__cxx11::string::compare(*(string **)(this + 8));
    bVar1 = (bool)(extraout_var >> 7);
  }
  return bVar1;
}

Assistant:

bool operator ()(const FieldDescriptor* f1, const FieldDescriptor* f2) const {
    if(f1 == NULL) {
      return false;
    }
    if(f2 == NULL) {
      return true;
    }
    return f1->full_name() < f2->full_name();
  }